

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingC.c
# Opt level: O0

size_t adios2sysEncoding_wcstombs(char *dest,wchar_t *str,size_t n)

{
  size_t in_RDX;
  wchar_t *in_RSI;
  char *in_RDI;
  undefined8 local_8;
  
  if (in_RSI == (wchar_t *)0x0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = wcstombs(in_RDI,in_RSI,in_RDX);
  }
  return local_8;
}

Assistant:

size_t kwsysEncoding_wcstombs(char* dest, const wchar_t* str, size_t n)
{
  if (str == 0) {
    return (size_t)-1;
  }
#ifdef _WIN32
  return WideCharToMultiByte(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str, -1, dest,
                             (int)n, NULL, NULL) -
    1;
#else
  return wcstombs(dest, str, n);
#endif
}